

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O0

int __thiscall ncnn::Gemm_x86::create_pipeline(Gemm_x86 *this,Option *opt)

{
  float fVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  undefined8 *puVar6;
  long *plVar7;
  byte *in_RSI;
  long *in_RDI;
  bool bVar8;
  int i_1;
  int size;
  Mat C2;
  int C_elempack;
  Mat BT_tile;
  int max_kk_1;
  int max_jj;
  int k_1;
  int j;
  int ppk;
  int ppj_1;
  int ppjk;
  int nn_NK;
  int nn_K;
  int nn_N;
  int TILE_K_1;
  int TILE_N_1;
  int TILE_M_1;
  int K_1;
  int N;
  Mat AT_tile;
  int max_kk;
  int max_ii;
  int k;
  int i;
  int ppj;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int K;
  int M;
  Mat *m_1;
  Mat *m;
  undefined4 in_stack_fffffffffffff8e0;
  undefined4 in_stack_fffffffffffff8e4;
  Mat *in_stack_fffffffffffff8e8;
  Mat *in_stack_fffffffffffff8f0;
  Option *in_stack_fffffffffffff8f8;
  void **ppvVar9;
  Mat *in_stack_fffffffffffff900;
  Mat *in_stack_fffffffffffff908;
  void **ppvVar10;
  Mat *in_stack_fffffffffffff910;
  undefined8 in_stack_fffffffffffff940;
  long *plVar11;
  undefined8 in_stack_fffffffffffff948;
  long *plVar12;
  undefined8 in_stack_fffffffffffff950;
  int *in_stack_fffffffffffff960;
  int *in_stack_fffffffffffff968;
  int *in_stack_fffffffffffff970;
  undefined8 in_stack_fffffffffffff978;
  undefined8 in_stack_fffffffffffff980;
  int iVar13;
  undefined8 in_stack_fffffffffffff988;
  int iVar14;
  undefined4 in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff994;
  Mat *in_stack_fffffffffffff998;
  int local_5f8;
  void *local_5f0;
  int *local_5e8;
  void *local_5e0;
  undefined4 local_5d8;
  long *local_5d0;
  undefined4 local_5c8;
  undefined4 local_5c4;
  undefined4 local_5c0;
  undefined4 local_5bc;
  undefined4 local_5b8;
  void *local_5b0;
  undefined4 local_5a4;
  undefined8 local_5a0;
  undefined8 local_598;
  undefined8 local_590;
  undefined4 local_588;
  Allocator *local_580;
  undefined4 local_578;
  undefined4 local_574;
  undefined4 local_570;
  undefined4 local_56c;
  undefined4 local_568;
  undefined8 local_560;
  Mat local_558;
  int local_510;
  int local_50c;
  int local_508;
  int local_504;
  int local_500;
  int local_4fc;
  int local_4f8;
  int local_4f4;
  int local_4f0;
  int local_4ec;
  int local_4e8;
  int local_4e4;
  int local_4e0;
  int local_4dc [2];
  int local_4d4;
  int local_4d0;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined4 local_4a8;
  long *local_4a0;
  undefined4 local_498;
  undefined4 local_494;
  undefined4 local_490;
  undefined4 local_48c;
  undefined4 local_488;
  undefined8 local_480;
  void *local_478;
  int *local_470;
  long local_468;
  undefined4 local_460;
  long *local_458;
  undefined4 local_450;
  int local_44c;
  undefined4 local_448;
  undefined4 local_444;
  undefined4 local_440;
  long local_438;
  int local_42c;
  int local_428;
  int local_424;
  int local_420;
  int local_41c;
  int local_418;
  int local_414;
  int local_410;
  int local_40c [2];
  int local_404;
  int local_400;
  int local_3fc;
  byte *local_3f8;
  void **local_3e0;
  undefined8 *local_3d8;
  void **local_3c8;
  int in_stack_fffffffffffffc40;
  int in_stack_fffffffffffffc44;
  Mat *in_stack_fffffffffffffc50;
  Mat *in_stack_fffffffffffffc58;
  void **in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  Mat *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  
  iVar13 = (int)in_stack_fffffffffffff978;
  local_3f8 = in_RSI;
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) != 0) {
    local_3fc = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec);
    local_400 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4);
    in_stack_fffffffffffff8e0 = *(undefined4 *)(in_RSI + 4);
    get_optimal_tile_mnk
              ((int)((ulong)in_stack_fffffffffffff950 >> 0x20),(int)in_stack_fffffffffffff950,
               (int)((ulong)in_stack_fffffffffffff948 >> 0x20),(int)in_stack_fffffffffffff948,
               (int)((ulong)in_stack_fffffffffffff940 >> 0x20),(int)in_stack_fffffffffffff940,
               in_stack_fffffffffffff960,in_stack_fffffffffffff968,in_stack_fffffffffffff970,iVar13)
    ;
    local_410 = (local_3fc + local_404 + -1) / local_404;
    Mat::create(in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
                (int)in_stack_fffffffffffff8f8,(int)((ulong)in_stack_fffffffffffff8f0 >> 0x20),
                (size_t)in_stack_fffffffffffff8e8,
                (Allocator *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    bVar8 = true;
    if (in_RDI[2] != 0) {
      bVar8 = in_RDI[10] * (long)(int)in_RDI[9] == 0;
    }
    if (bVar8) {
      return -100;
    }
    for (local_414 = 0; iVar13 = (int)in_stack_fffffffffffff978, local_414 < local_410;
        local_414 = local_414 + 1) {
      local_418 = local_414 * local_404;
      for (local_41c = 0; local_41c < local_400; local_41c = local_40c[0] + local_41c) {
        local_424 = local_3fc - local_418;
        piVar5 = std::min<int>(&local_424,&local_404);
        local_420 = *piVar5;
        local_42c = local_400 - local_41c;
        piVar5 = std::min<int>(&local_42c,local_40c);
        local_428 = *piVar5;
        local_44c = *(int *)((long)in_RDI + 0x3c);
        local_468 = in_RDI[4];
        local_460 = (undefined4)in_RDI[5];
        local_4a0 = (long *)in_RDI[6];
        in_stack_fffffffffffffcf0 = &local_478;
        local_478 = (void *)(in_RDI[2] + in_RDI[10] * (long)(local_418 / local_404) * in_RDI[4] +
                            (long)local_44c * (long)(local_41c / local_40c[0]) * local_468);
        local_438 = (long)local_44c;
        local_3d8 = &local_4c0;
        local_440 = 1;
        local_444 = 1;
        local_448 = 1;
        local_450 = 2;
        local_470 = (int *)0x0;
        local_4c0 = 0;
        local_4b0 = 0;
        local_4a8 = 0;
        local_498 = 0;
        local_494 = 0;
        local_490 = 0;
        local_48c = 0;
        local_488 = 0;
        local_480 = 0;
        local_4b8 = 0;
        iVar13 = (int)((ulong)in_stack_fffffffffffff980 >> 0x20);
        iVar14 = (int)((ulong)in_stack_fffffffffffff988 >> 0x20);
        local_458 = local_4a0;
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 0) {
          pack_A_tile(in_stack_fffffffffffff998,
                      (Mat *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),iVar14,
                      (int)in_stack_fffffffffffff988,iVar13,(int)in_stack_fffffffffffff980);
        }
        else {
          transpose_pack_A_tile
                    (in_stack_fffffffffffff998,
                     (Mat *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),iVar14,
                     (int)in_stack_fffffffffffff988,iVar13,(int)in_stack_fffffffffffff980);
        }
        local_3c8 = &local_478;
        if (local_470 != (int *)0x0) {
          LOCK();
          iVar13 = *local_470;
          *local_470 = *local_470 + -1;
          UNLOCK();
          if (iVar13 == 1) {
            if (local_458 == (long *)0x0) {
              if (local_478 != (void *)0x0) {
                free(local_478);
              }
            }
            else {
              (**(code **)(*local_458 + 0x18))(local_458,local_478);
            }
          }
        }
        local_478 = (void *)0x0;
        local_468 = 0;
        local_460 = 0;
        local_450 = 0;
        local_44c = 0;
        local_448 = 0;
        local_444 = 0;
        local_440 = 0;
        local_438 = 0;
        local_470 = (int *)0x0;
      }
    }
    if ((*local_3f8 & 1) != 0) {
      lVar2 = *(long *)(*in_RDI + -0x18);
      puVar6 = (undefined8 *)((long)in_RDI + lVar2 + 0x118);
      if (*(long *)((long)in_RDI + lVar2 + 0x120) != 0) {
        piVar5 = *(int **)((long)in_RDI + lVar2 + 0x120);
        LOCK();
        iVar14 = *piVar5;
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (iVar14 == 1) {
          if (*(long *)((long)in_RDI + lVar2 + 0x138) == 0) {
            if ((void *)*puVar6 != (void *)0x0) {
              free((void *)*puVar6);
            }
          }
          else {
            plVar7 = *(long **)((long)in_RDI + lVar2 + 0x138);
            (**(code **)(*plVar7 + 0x18))(plVar7,*puVar6);
          }
        }
      }
      *puVar6 = 0;
      *(undefined8 *)((long)in_RDI + lVar2 + 0x128) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x130) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x140) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x144) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x148) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x14c) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x150) = 0;
      *(undefined8 *)((long)in_RDI + lVar2 + 0x158) = 0;
      *(undefined8 *)((long)in_RDI + lVar2 + 0x120) = 0;
    }
  }
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) != 0) {
    local_4d0 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0);
    local_4d4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4);
    in_stack_fffffffffffff8e0 = *(undefined4 *)(local_3f8 + 4);
    get_optimal_tile_mnk
              ((int)((ulong)in_stack_fffffffffffff950 >> 0x20),(int)in_stack_fffffffffffff950,
               (int)((ulong)in_stack_fffffffffffff948 >> 0x20),(int)in_stack_fffffffffffff948,
               (int)((ulong)in_stack_fffffffffffff940 >> 0x20),(int)in_stack_fffffffffffff940,
               in_stack_fffffffffffff960,in_stack_fffffffffffff968,in_stack_fffffffffffff970,iVar13)
    ;
    local_4e4 = (local_4d0 + local_4dc[0] + -1) / local_4dc[0];
    local_4e8 = (local_4d4 + local_4e0 + -1) / local_4e0;
    Mat::create(in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
                (int)in_stack_fffffffffffff8f8,(int)((ulong)in_stack_fffffffffffff8f0 >> 0x20),
                (size_t)in_stack_fffffffffffff8e8,
                (Allocator *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    bVar8 = true;
    if (in_RDI[0xb] != 0) {
      bVar8 = in_RDI[0x13] * (long)(int)in_RDI[0x12] == 0;
    }
    if (bVar8) {
      return -100;
    }
    local_4ec = local_4e4 * local_4e8;
    for (local_4f0 = 0; local_4f0 < local_4ec; local_4f0 = local_4f0 + 1) {
      local_4f4 = local_4f0 / local_4e8;
      local_4f8 = local_4f0 % local_4e8;
      local_4fc = local_4f4 * local_4dc[0];
      local_500 = local_4f8 * local_4e0;
      local_508 = local_4d0 - local_4fc;
      piVar5 = std::min<int>(&local_508,local_4dc);
      local_504 = *piVar5;
      local_510 = local_4d4 - local_500;
      piVar5 = std::min<int>(&local_510,&local_4e0);
      local_50c = *piVar5;
      local_558.w = *(int *)((long)in_RDI + 0x84);
      local_558.elemsize = in_RDI[0xd];
      local_558.elempack = (int)in_RDI[0xe];
      local_580 = (Allocator *)in_RDI[0xf];
      local_558.data =
           (void *)(in_RDI[0xb] + in_RDI[0x13] * (long)(local_4fc / local_4dc[0]) * in_RDI[0xd] +
                   (long)local_558.w * (long)(local_500 / local_4e0) * local_558.elemsize);
      local_558.cstep = (size_t)local_558.w;
      local_558.c = 1;
      local_558.d = 1;
      local_558.h = 1;
      local_558.dims = 2;
      local_558.refcount = (int *)0x0;
      local_5a0 = 0;
      local_590 = 0;
      local_588 = 0;
      local_578 = 0;
      local_574 = 0;
      local_570 = 0;
      local_56c = 0;
      local_568 = 0;
      local_560 = 0;
      local_598 = 0;
      local_558.allocator = local_580;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 0) {
        transpose_pack_B_tile
                  (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                   (int)((ulong)&local_5a0 >> 0x20),(int)&local_5a0,in_stack_fffffffffffffc44,
                   in_stack_fffffffffffffc40);
      }
      else {
        pack_B_tile((Mat *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                    in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8,
                    (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20),(int)in_stack_fffffffffffffcf0);
      }
      in_stack_fffffffffffffc58 = &local_558;
      if (local_558.refcount != (int *)0x0) {
        LOCK();
        iVar13 = *local_558.refcount;
        *local_558.refcount = *local_558.refcount + -1;
        UNLOCK();
        if (iVar13 == 1) {
          if (local_558.allocator == (Allocator *)0x0) {
            if (local_558.data != (void *)0x0) {
              free(local_558.data);
            }
          }
          else {
            (*(local_558.allocator)->_vptr_Allocator[3])(local_558.allocator,local_558.data);
          }
        }
      }
      local_558.data = (void *)0x0;
      local_558.elemsize = 0;
      local_558.elempack = 0;
      local_558.dims = 0;
      local_558.w = 0;
      local_558.h = 0;
      local_558.d = 0;
      local_558.c = 0;
      local_558.cstep = 0;
      local_558.refcount = (int *)0x0;
    }
    if ((*local_3f8 & 1) != 0) {
      lVar2 = *(long *)(*in_RDI + -0x18);
      puVar6 = (undefined8 *)((long)in_RDI + lVar2 + 0x160);
      if (*(long *)((long)in_RDI + lVar2 + 0x168) != 0) {
        piVar5 = *(int **)((long)in_RDI + lVar2 + 0x168);
        LOCK();
        iVar13 = *piVar5;
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (iVar13 == 1) {
          if (*(long *)((long)in_RDI + lVar2 + 0x180) == 0) {
            if ((void *)*puVar6 != (void *)0x0) {
              free((void *)*puVar6);
            }
          }
          else {
            plVar7 = *(long **)((long)in_RDI + lVar2 + 0x180);
            (**(code **)(*plVar7 + 0x18))(plVar7,*puVar6);
          }
        }
      }
      *puVar6 = 0;
      puVar6[2] = 0;
      *(undefined4 *)(puVar6 + 3) = 0;
      *(undefined4 *)(puVar6 + 5) = 0;
      *(undefined4 *)((long)puVar6 + 0x2c) = 0;
      *(undefined4 *)(puVar6 + 6) = 0;
      *(undefined4 *)((long)puVar6 + 0x34) = 0;
      *(undefined4 *)(puVar6 + 7) = 0;
      puVar6[8] = 0;
      puVar6[1] = 0;
    }
  }
  iVar13 = (int)((ulong)in_stack_fffffffffffff900 >> 0x20);
  if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) != 0) &&
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8) != -1)) {
    lVar2 = *(long *)(*in_RDI + -0x18);
    plVar7 = (long *)((long)in_RDI + lVar2 + 0x1a8);
    plVar11 = in_RDI + 0x14;
    if (plVar11 != plVar7) {
      if (*(long *)((long)in_RDI + lVar2 + 0x1b0) != 0) {
        piVar5 = *(int **)((long)in_RDI + lVar2 + 0x1b0);
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      plVar12 = plVar11;
      if (in_RDI[0x15] != 0) {
        piVar5 = (int *)in_RDI[0x15];
        LOCK();
        iVar14 = *piVar5;
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (iVar14 == 1) {
          if (in_RDI[0x18] == 0) {
            if ((void *)*plVar11 != (void *)0x0) {
              free((void *)*plVar11);
            }
          }
          else {
            (**(code **)(*(long *)in_RDI[0x18] + 0x18))((long *)in_RDI[0x18],*plVar11);
          }
        }
      }
      *plVar11 = 0;
      plVar11[2] = 0;
      *(undefined4 *)(plVar11 + 3) = 0;
      *(undefined4 *)(plVar11 + 5) = 0;
      *(undefined4 *)((long)plVar11 + 0x2c) = 0;
      *(undefined4 *)(plVar11 + 6) = 0;
      *(undefined4 *)((long)plVar11 + 0x34) = 0;
      *(undefined4 *)(plVar11 + 7) = 0;
      plVar11[8] = 0;
      plVar11[1] = 0;
      *plVar12 = *plVar7;
      plVar12[1] = *(long *)((long)in_RDI + lVar2 + 0x1b0);
      plVar12[2] = *(long *)((long)in_RDI + lVar2 + 0x1b8);
      *(undefined4 *)(plVar12 + 3) = *(undefined4 *)((long)in_RDI + lVar2 + 0x1c0);
      plVar12[4] = *(long *)((long)in_RDI + lVar2 + 0x1c8);
      *(undefined4 *)(plVar12 + 5) = *(undefined4 *)((long)in_RDI + lVar2 + 0x1d0);
      *(undefined4 *)((long)plVar12 + 0x2c) = *(undefined4 *)((long)in_RDI + lVar2 + 0x1d4);
      *(undefined4 *)(plVar12 + 6) = *(undefined4 *)((long)in_RDI + lVar2 + 0x1d8);
      *(undefined4 *)((long)plVar12 + 0x34) = *(undefined4 *)((long)in_RDI + lVar2 + 0x1dc);
      *(undefined4 *)(plVar12 + 7) = *(undefined4 *)((long)in_RDI + lVar2 + 0x1e0);
      plVar12[8] = *(long *)((long)in_RDI + lVar2 + 0x1e8);
    }
    if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8) == 3) &&
       ((local_3f8[0x27] & 1) != 0)) {
      local_5a4 = 1;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) % 4 == 0) {
        local_5a4 = 4;
      }
      convert_packing(in_stack_fffffffffffff910,in_stack_fffffffffffff908,iVar13,
                      in_stack_fffffffffffff8f8);
    }
    fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
    if ((fVar1 != 1.0) || (NAN(fVar1))) {
      local_3e0 = &local_5f0;
      local_5f0 = (void *)0x0;
      local_5e8 = (int *)0x0;
      local_5e0 = (void *)0x0;
      local_5d8 = 0;
      local_5d0 = (long *)0x0;
      local_5c8 = 0;
      local_5c4 = 0;
      local_5c0 = 0;
      local_5bc = 0;
      local_5b8 = 0;
      local_5b0 = (void *)0x0;
      Mat::create_like(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
                       (Allocator *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
      lVar2 = in_RDI[0x1c];
      lVar3 = in_RDI[0x1b];
      lVar4 = in_RDI[0x17];
      for (local_5f8 = 0; local_5f8 < (int)lVar2 * (int)lVar3 * (int)lVar4;
          local_5f8 = local_5f8 + 1) {
        *(float *)((long)local_5f0 + (long)local_5f8 * 4) =
             *(float *)(in_RDI[0x14] + (long)local_5f8 * 4) *
             *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      }
      ppvVar9 = (void **)(in_RDI + 0x14);
      if (ppvVar9 != &local_5f0) {
        if (local_5e8 != (int *)0x0) {
          LOCK();
          *local_5e8 = *local_5e8 + 1;
          UNLOCK();
        }
        ppvVar10 = ppvVar9;
        if (in_RDI[0x15] != 0) {
          piVar5 = (int *)in_RDI[0x15];
          LOCK();
          iVar13 = *piVar5;
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (iVar13 == 1) {
            if (in_RDI[0x18] == 0) {
              if (*ppvVar9 != (void *)0x0) {
                free(*ppvVar9);
              }
            }
            else {
              (**(code **)(*(long *)in_RDI[0x18] + 0x18))((long *)in_RDI[0x18],*ppvVar9);
            }
          }
        }
        *ppvVar9 = (void *)0x0;
        ppvVar9[2] = (void *)0x0;
        *(undefined4 *)(ppvVar9 + 3) = 0;
        *(undefined4 *)(ppvVar9 + 5) = 0;
        *(undefined4 *)((long)ppvVar9 + 0x2c) = 0;
        *(undefined4 *)(ppvVar9 + 6) = 0;
        *(undefined4 *)((long)ppvVar9 + 0x34) = 0;
        *(undefined4 *)(ppvVar9 + 7) = 0;
        ppvVar9[8] = (void *)0x0;
        ppvVar9[1] = (void *)0x0;
        *ppvVar10 = local_5f0;
        ppvVar10[1] = local_5e8;
        ppvVar10[2] = local_5e0;
        *(undefined4 *)(ppvVar10 + 3) = local_5d8;
        ppvVar10[4] = local_5d0;
        *(undefined4 *)(ppvVar10 + 5) = local_5c8;
        *(undefined4 *)((long)ppvVar10 + 0x2c) = local_5c4;
        *(undefined4 *)(ppvVar10 + 6) = local_5c0;
        *(undefined4 *)((long)ppvVar10 + 0x34) = local_5bc;
        *(undefined4 *)(ppvVar10 + 7) = local_5b8;
        ppvVar10[8] = local_5b0;
      }
      ppvVar9 = &local_5f0;
      if (local_5e8 != (int *)0x0) {
        LOCK();
        iVar13 = *local_5e8;
        *local_5e8 = *local_5e8 + -1;
        UNLOCK();
        if (iVar13 == 1) {
          if (local_5d0 == (long *)0x0) {
            if (local_5f0 != (void *)0x0) {
              free(local_5f0);
            }
          }
          else {
            (**(code **)(*local_5d0 + 0x18))(local_5d0,local_5f0);
          }
        }
      }
      *ppvVar9 = (void *)0x0;
      ppvVar9[2] = (void *)0x0;
      *(undefined4 *)(ppvVar9 + 3) = 0;
      *(undefined4 *)(ppvVar9 + 5) = 0;
      *(undefined4 *)((long)ppvVar9 + 0x2c) = 0;
      *(undefined4 *)(ppvVar9 + 6) = 0;
      *(undefined4 *)((long)ppvVar9 + 0x34) = 0;
      *(undefined4 *)(ppvVar9 + 7) = 0;
      ppvVar9[8] = (void *)0x0;
      ppvVar9[1] = (void *)0x0;
    }
    if ((*local_3f8 & 1) != 0) {
      lVar2 = *(long *)(*in_RDI + -0x18);
      puVar6 = (undefined8 *)((long)in_RDI + lVar2 + 0x1a8);
      if (*(long *)((long)in_RDI + lVar2 + 0x1b0) != 0) {
        piVar5 = *(int **)((long)in_RDI + lVar2 + 0x1b0);
        LOCK();
        iVar13 = *piVar5;
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (iVar13 == 1) {
          if (*(long *)((long)in_RDI + lVar2 + 0x1c8) == 0) {
            if ((void *)*puVar6 != (void *)0x0) {
              free((void *)*puVar6);
            }
          }
          else {
            plVar7 = *(long **)((long)in_RDI + lVar2 + 0x1c8);
            (**(code **)(*plVar7 + 0x18))(plVar7,*puVar6);
          }
        }
      }
      *puVar6 = 0;
      puVar6[2] = 0;
      *(undefined4 *)(puVar6 + 3) = 0;
      *(undefined4 *)(puVar6 + 5) = 0;
      *(undefined4 *)((long)puVar6 + 0x2c) = 0;
      *(undefined4 *)(puVar6 + 6) = 0;
      *(undefined4 *)((long)puVar6 + 0x34) = 0;
      *(undefined4 *)(puVar6 + 7) = 0;
      puVar6[8] = 0;
      puVar6[1] = 0;
    }
  }
  if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) != 0) ||
      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) != 0)) ||
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) != 0)) {
    *(undefined4 *)(in_RDI + 1) = *(undefined4 *)(local_3f8 + 4);
  }
  return 0;
}

Assistant:

int Gemm_x86::create_pipeline(const Option& opt)
{
    if (constantA)
    {
        const int M = constantM;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk(M, 0, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_M = (M + TILE_M - 1) / TILE_M;

        AT_data.create(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 4u, (Allocator*)0);
        if (AT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_M; ppj++)
        {
            const int i = ppj * TILE_M;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_ii = std::min((M - i), TILE_M);
                const int max_kk = std::min((K - k), TILE_K);

                Mat AT_tile = AT_data.channel(i / TILE_M).row_range(k / TILE_K, 1);

                if (transA)
                {
                    transpose_pack_A_tile(A_data, AT_tile, i, max_ii, k, max_kk);
                }
                else
                {
                    pack_A_tile(A_data, AT_tile, i, max_ii, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
        {
            A_data.release();
        }
    }

    if (constantB)
    {
        const int N = constantN;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk(0, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_N = (N + TILE_N - 1) / TILE_N;
        const int nn_K = (K + TILE_K - 1) / TILE_K;

        BT_data.create(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, (Allocator*)0);
        if (BT_data.empty())
            return -100;

        const int nn_NK = nn_N * nn_K;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat BT_tile = BT_data.channel(j / TILE_N).row_range(k / TILE_K, 1);

            if (transB)
            {
                pack_B_tile(B_data, BT_tile, j, max_jj, k, max_kk);
            }
            else
            {
                transpose_pack_B_tile(B_data, BT_tile, j, max_jj, k, max_kk);
            }
        }

        if (opt.lightmode)
        {
            B_data.release();
        }
    }

    if (constantC && constant_broadcast_type_C != -1)
    {
        CT_data = C_data;

#if __SSE2__
        if (constant_broadcast_type_C == 3 && opt.use_packing_layout)
        {
#if __AVX512F__
            int C_elempack = constantM % 16 == 0 ? 16 : constantM % 8 == 0 ? 8 : constantM % 4 == 0 ? 4 : 1;
#elif __AVX__
            int C_elempack = constantM % 8 == 0 ? 8 : constantM % 4 == 0 ? 4 : 1;
#else
            int C_elempack = constantM % 4 == 0 ? 4 : 1;
#endif
            convert_packing(C_data, CT_data, C_elempack, opt);
        }
#endif // __SSE2__

        // pre-multiply C with beta
        if (beta != 1.f)
        {
            Mat C2;
            C2.create_like(CT_data);

            const int size = CT_data.total() * CT_data.elempack;
            for (int i = 0; i < size; i++)
            {
                C2[i] = CT_data[i] * beta;
            }

            CT_data = C2;
        }

        if (opt.lightmode)
        {
            C_data.release();
        }
    }

    if (constantA || constantB || constantC)
    {
        nT = opt.num_threads;
    }

    return 0;
}